

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

DebuggerScope * __thiscall
Js::FunctionBody::AddScopeObject
          (FunctionBody *this,DiagExtraScopesType scopeType,int start,RegSlot scopeLocation)

{
  Type pRVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Recycler *alloc;
  undefined **local_58;
  DebuggerScope *scopeObject;
  size_t local_48;
  char *local_40;
  DWORD local_38;
  
  if ((this->m_sourceInfo).pScopeObjectChain.ptr == (ScopeObjectChain *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1ef1,"(GetScopeObjectChain())","GetScopeObjectChain()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  local_58 = &DebuggerScope::typeinfo;
  scopeObject = (DebuggerScope *)0x0;
  local_48 = 0xffffffffffffffff;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
  ;
  local_38 = 0x1ef3;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                     recycler,(TrackAllocData *)&stack0xffffffffffffffa8);
  local_58 = (undefined **)new<Memory::Recycler>(0x40,alloc,0x37a1d4);
  pRVar1 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
  ((DebuggerScope *)local_58)->_vptr_DebuggerScope = (_func_int **)&PTR__DebuggerScope_013777c8;
  (((DebuggerScope *)local_58)->scopeProperties).ptr =
       (List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  ((DebuggerScope *)local_58)->scopeType = scopeType;
  (((DebuggerScope *)local_58)->siblingScope).ptr = (DebuggerScope *)0x0;
  ((DebuggerScope *)local_58)->recycler = pRVar1;
  (((DebuggerScope *)local_58)->parentScope).ptr = (DebuggerScope *)0x0;
  ((DebuggerScope *)local_58)->scopeLocation = scopeLocation;
  (((DebuggerScope *)local_58)->range).begin = start;
  (((DebuggerScope *)local_58)->range).end = -1;
  JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add((((this->m_sourceInfo).pScopeObjectChain.ptr)->pScopeChain).ptr,
        (DebuggerScope **)&stack0xffffffffffffffa8);
  return (DebuggerScope *)local_58;
}

Assistant:

DebuggerScope * FunctionBody::AddScopeObject(DiagExtraScopesType scopeType, int start, RegSlot scopeLocation)
    {
        Assert(GetScopeObjectChain());

        DebuggerScope *scopeObject = RecyclerNew(m_scriptContext->GetRecycler(), DebuggerScope, m_scriptContext->GetRecycler(), scopeType, scopeLocation, start);
        GetScopeObjectChain()->pScopeChain->Add(scopeObject);

        return scopeObject;
    }